

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

vm_prop_id_t __thiscall CVmImageLoader::get_last_prop(CVmImageLoader *this)

{
  vm_val_t *in_RDI;
  vm_val_t ele;
  vm_val_t vec;
  vm_prop_id_t local_20;
  undefined4 in_stack_fffffffffffffff4;
  
  vm_val_t::set_obj((vm_val_t *)&stack0xffffffffffffffe8,G_predef_X.last_prop_obj);
  vm_val_t::ll_index((vm_val_t *)ele._0_8_,in_RDI,in_stack_fffffffffffffff4);
  return local_20;
}

Assistant:

vm_prop_id_t CVmImageLoader::get_last_prop(VMG0_)
{
    /* get LastPropObj[1] */
    vm_val_t vec, ele;
    vec.set_obj(G_predef->last_prop_obj);
    vec.ll_index(vmg_ &ele, 1);

    /* return the value */
    return ele.val.prop;
}